

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tct3.cpp
# Opt level: O0

void __thiscall
CTcSymMetaclass::gen_code_member
          (CTcSymMetaclass *this,int discard,CTcPrsNode *prop_expr,int prop_is_expr,int argc,
          int varargs,CTcNamedArgs *named_args)

{
  size_t sVar1;
  char *pcVar2;
  int in_ECX;
  CTcPrsNode *in_RDX;
  int in_ESI;
  CTcNamedArgs *in_RDI;
  int in_R8D;
  int in_R9D;
  uchar in_stack_000000bf;
  CTcGenTarg *in_stack_000000c0;
  
  if (((ulong)in_RDI[5].args & 1) == 0) {
    (**(code **)(*(long *)in_RDI + 0xc0))(in_RDI,0);
    if (in_R9D != 0) {
      CTcGenTarg::write_op(in_stack_000000c0,in_stack_000000bf);
    }
    CTcPrsNode::s_gen_member_rhs(in_ESI,in_RDX,in_ECX,in_R8D,in_R9D,in_RDI);
  }
  else {
    sVar1 = CTcSymbolBase::get_sym_len((CTcSymbolBase *)0x285936);
    pcVar2 = CTcSymbolBase::get_sym((CTcSymbolBase *)0x285944);
    CTcTokenizer::log_error(0x2d2d,sVar1 & 0xffffffff,pcVar2);
  }
  return;
}

Assistant:

void CTcSymMetaclass::gen_code_member(int discard, CTcPrsNode *prop_expr,
                                      int prop_is_expr,
                                      int argc, int varargs,
                                      CTcNamedArgs *named_args)
{
    /* if this is an external metaclass, we can't generate code */
    if (ext_)
    {
        G_tok->log_error(TCERR_EXT_METACLASS, (int)get_sym_len(), get_sym());
        return;
    }

    /* generate code to push our class object onto the stack */
    gen_code(FALSE);

    /* if we have an argument counter, put it back on top */
    if (varargs)
        G_cg->write_op(OPC_SWAP);

    /* use the standard member generation */
    CTcPrsNode::s_gen_member_rhs(discard, prop_expr, prop_is_expr,
                                 argc, varargs, named_args);
}